

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall SpeciesTracker::Register(SpeciesTracker *this,Ptr *reaction)

{
  element_type *peVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reactant;
  pointer pbVar3;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pbVar2 = (peVar1->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (peVar1->reactants_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SpeciesReaction,void>
              (local_40,&reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>);
    Add(this,pbVar3,(Ptr *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    Increment(this,pbVar3,0);
  }
  peVar1 = (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pbVar2 = (peVar1->products_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (peVar1->products_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SpeciesReaction,void>
              (local_50,&reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>);
    Add(this,pbVar3,(Ptr *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    Increment(this,pbVar3,0);
  }
  return;
}

Assistant:

void SpeciesTracker::Register(SpeciesReaction::Ptr reaction) {
  // Add this reaction to SpeciesTracker
  for (const auto &reactant : reaction->reactants()) {
    Add(reactant, reaction);
    // Initialize reactant counts (this usually gets set to some non-zero
    // value later)
    Increment(reactant, 0);
  }
  // Do the same for products
  for (const auto &product : reaction->products()) {
    Add(product, reaction);
    Increment(product, 0);
  }
}